

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::BlockDisconnected
          (ValidationSignals *this,shared_ptr<const_CBlock> *pblock,CBlockIndex *pindex)

{
  bool bVar1;
  pointer pTVar2;
  long in_RDX;
  LogFlags in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000040;
  char **in_stack_00000050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  char *local_name;
  anon_class_32_3_7b0f8e0f_for_event event;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  anon_class_32_3_7b0f8e0f_for_event *in_stack_fffffffffffffea8;
  anon_class_64_4_f5b1b096 *in_stack_fffffffffffffeb0;
  CBlockHeader *in_stack_fffffffffffffeb8;
  int source_line;
  ConstevalFormatString<3U> in_stack_ffffffffffffff48;
  string_view in_stack_ffffffffffffff50;
  string_view in_stack_ffffffffffffff60;
  anon_class_32_3_7b0f8e0f_for_event local_70 [2];
  element_type *local_8;
  
  source_line = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(element_type **)(in_FS_OFFSET + 0x28);
  std::shared_ptr<const_CBlock>::shared_ptr
            ((shared_ptr<const_CBlock> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (shared_ptr<const_CBlock> *)0x14f59a7);
  local_70[0].pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1d3ae51;
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb8,
               (char *)in_stack_fffffffffffffeb0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb8,
               (char *)in_stack_fffffffffffffeb0);
    std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    CBlockHeader::GetHash(in_stack_fffffffffffffeb8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffea0);
    in_stack_fffffffffffffeb8 = (CBlockHeader *)(in_RDX + 0x18);
    in_stack_fffffffffffffeb0 = (anon_class_64_4_f5b1b096 *)&stack0xffffffffffffffd8;
    in_stack_fffffffffffffea8 = local_70;
    in_stack_fffffffffffffea0 = "Enqueuing %s: block hash=%s block height=%d\n";
    in_stack_fffffffffffffe98 = 1;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,int>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,source_line,in_RSI,
               in_stack_00000040,in_stack_ffffffffffffff48,in_stack_00000050,in_stack_00000058,
               (int *)pindex);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  pTVar2 = std::
           unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
           operator->((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  std::shared_ptr<const_CBlock>::shared_ptr
            ((shared_ptr<const_CBlock> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (shared_ptr<const_CBlock> *)0x14f5b4b);
  BlockDisconnected(std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::$_1::__1
            (in_stack_fffffffffffffea8,
             (anon_class_32_3_7b0f8e0f_for_event *)in_stack_fffffffffffffea0);
  std::function<void()>::
  function<ValidationSignals::BlockDisconnected(std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::__0,void>
            ((function<void_()> *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  (*pTVar2->_vptr_TaskRunnerInterface[2])(pTVar2,&stack0xffffffffffffff50);
  std::function<void_()>::~function
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  BlockDisconnected(std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::$_0::~__0
            ((anon_class_64_4_f5b1b096 *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  BlockDisconnected(std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::$_1::~__1
            ((anon_class_32_3_7b0f8e0f_for_event *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (*(element_type **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::BlockDisconnected(const std::shared_ptr<const CBlock>& pblock, const CBlockIndex* pindex)
{
    auto event = [pblock, pindex, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.BlockDisconnected(pblock, pindex); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block hash=%s block height=%d", __func__,
                          pblock->GetHash().ToString(),
                          pindex->nHeight);
}